

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

void __thiscall
lsh::vector::vector(vector *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *cs,uint s)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator __position;
  uint *__args;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->size_ = s;
  uVar2 = (long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  this_00 = &this->components_;
  uVar1 = (long)uVar2 >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(this_00,uVar1 & 0xffffffff);
  if ((int)(uVar2 >> 2) != 0) {
    uVar1 = uVar1 & 0xffffffff;
    lVar3 = 0;
    do {
      __args = (uint *)((long)(cs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar3);
      __position._M_current =
           (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar3 = lVar3 + 4;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  if ((this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>::
    _S_do_it(this_00);
    return;
  }
  return;
}

Assistant:

vector::vector(const std::vector<unsigned int>& cs, unsigned int s) {
    this->size_ = s;

    unsigned int n = cs.size();

    this->components_.reserve(n);

    for (unsigned int i = 0; i < n; i++) {
      this->components_.push_back(cs[i]);
    }

    this->components_.shrink_to_fit();
  }